

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_proxy.c
# Opt level: O0

CURLcode https_proxy_connect(connectdata *conn,int sockindex)

{
  CURLcode local_18;
  CURLcode result;
  int sockindex_local;
  connectdata *conn_local;
  
  local_18 = CURLE_OK;
  if ((((conn->bits).proxy_ssl_connected[sockindex] & 1U) == 0) &&
     (local_18 = Curl_ssl_connect_nonblocking
                           (conn,sockindex,(conn->bits).proxy_ssl_connected + sockindex),
     local_18 != CURLE_OK)) {
    (conn->bits).close = true;
  }
  return local_18;
}

Assistant:

static CURLcode https_proxy_connect(struct connectdata *conn, int sockindex)
{
#ifdef USE_SSL
  CURLcode result = CURLE_OK;
  DEBUGASSERT(conn->http_proxy.proxytype == CURLPROXY_HTTPS);
  if(!conn->bits.proxy_ssl_connected[sockindex]) {
    /* perform SSL initialization for this socket */
    result =
      Curl_ssl_connect_nonblocking(conn, sockindex,
                                   &conn->bits.proxy_ssl_connected[sockindex]);
    if(result)
      conn->bits.close = TRUE; /* a failed connection is marked for closure to
                                  prevent (bad) re-use or similar */
  }
  return result;
#else
  (void) conn;
  (void) sockindex;
  return CURLE_NOT_BUILT_IN;
#endif
}